

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.h
# Opt level: O0

void __thiscall
PartiallySignedTransaction::Serialize<DataStream>(PartiallySignedTransaction *this,DataStream *s)

{
  long lVar1;
  bool bVar2;
  uint32_t uVar3;
  KeyOriginInfo *in_RSI;
  long in_FS_OFFSET;
  PSBTOutput *output;
  vector<PSBTOutput,_std::allocator<PSBTOutput>_> *__range2_4;
  PSBTInput *input;
  vector<PSBTInput,_std::allocator<PSBTInput>_> *__range2_3;
  pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *entry_1;
  map<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  *__range2_2;
  PSBTProprietary *entry;
  set<PSBTProprietary,_std::less<PSBTProprietary>,_std::allocator<PSBTProprietary>_> *__range2_1;
  CExtPubKey *xpub;
  set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_> *__range3;
  pair<const_KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>_>
  *xpub_pair;
  map<KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>,_std::less<KeyOriginInfo>,_std::allocator<std::pair<const_KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>_>_>_>
  *__range2;
  const_iterator __end2_4;
  const_iterator __begin2_4;
  const_iterator __end2_3;
  const_iterator __begin2_3;
  const_iterator __end2_2;
  const_iterator __begin2_2;
  iterator __end2_1;
  iterator __begin2_1;
  iterator __end3;
  iterator __begin3;
  const_iterator __end2;
  const_iterator __begin2;
  uchar ser_xpub [78];
  CExtPubKey *in_stack_fffffffffffffe38;
  PSBTInput *in_stack_fffffffffffffe40;
  KeyOriginInfo *in_stack_fffffffffffffe48;
  PartiallySignedTransaction *in_stack_fffffffffffffe50;
  KeyOriginInfo *hd_keypath;
  KeyOriginInfo *s_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  DataStream::operator<<
            ((DataStream *)in_stack_fffffffffffffe48,(uchar (*) [5])in_stack_fffffffffffffe40);
  hd_keypath = in_RSI;
  CompactSizeWriter::CompactSizeWriter((CompactSizeWriter *)in_stack_fffffffffffffe38,0x6fd52b);
  SerializeToVector<DataStream,CompactSizeWriter>
            ((DataStream *)in_stack_fffffffffffffe50,(CompactSizeWriter *)in_stack_fffffffffffffe48)
  ;
  s_00 = in_RSI;
  std::optional<CMutableTransaction>::operator*
            ((optional<CMutableTransaction> *)in_stack_fffffffffffffe38);
  TransactionSerParams::operator()
            ((TransactionSerParams *)in_stack_fffffffffffffe48,
             (CMutableTransaction *)in_stack_fffffffffffffe40);
  SerializeToVector<DataStream,ParamsWrapper<TransactionSerParams,CMutableTransaction_const>>
            ((DataStream *)in_stack_fffffffffffffe50,
             (ParamsWrapper<TransactionSerParams,_const_CMutableTransaction> *)
             in_stack_fffffffffffffe48);
  std::
  map<KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>,_std::less<KeyOriginInfo>,_std::allocator<std::pair<const_KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>_>_>_>
  ::begin((map<KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>,_std::less<KeyOriginInfo>,_std::allocator<std::pair<const_KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>_>_>_>
           *)in_stack_fffffffffffffe40);
  std::
  map<KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>,_std::less<KeyOriginInfo>,_std::allocator<std::pair<const_KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>_>_>_>
  ::end((map<KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>,_std::less<KeyOriginInfo>,_std::allocator<std::pair<const_KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>_>_>_>
         *)in_stack_fffffffffffffe40);
  while( true ) {
    bVar2 = std::operator==((_Self *)in_stack_fffffffffffffe48,(_Self *)in_stack_fffffffffffffe40);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    std::
    _Rb_tree_const_iterator<std::pair<const_KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>_>_>
    ::operator*((_Rb_tree_const_iterator<std::pair<const_KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>_>_>
                 *)in_stack_fffffffffffffe38);
    std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>::begin
              ((set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_> *)
               in_stack_fffffffffffffe40);
    std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>::end
              ((set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_> *)
               in_stack_fffffffffffffe40);
    while( true ) {
      bVar2 = std::operator==((_Self *)in_stack_fffffffffffffe48,(_Self *)in_stack_fffffffffffffe40)
      ;
      if (((bVar2 ^ 0xffU) & 1) == 0) break;
      std::_Rb_tree_const_iterator<CExtPubKey>::operator*
                ((_Rb_tree_const_iterator<CExtPubKey> *)in_stack_fffffffffffffe38);
      CExtPubKey::EncodeWithVersion(in_stack_fffffffffffffe38,(uchar *)0x6fd682);
      SerializeToVector<DataStream,unsigned_char,unsigned_char[78]>
                ((DataStream *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48->fingerprint,
                 (uchar (*) [78])in_stack_fffffffffffffe40);
      KeyOriginInfo::KeyOriginInfo
                ((KeyOriginInfo *)in_stack_fffffffffffffe38,(KeyOriginInfo *)0x6fd6c2);
      SerializeHDKeypath<DataStream>((DataStream *)s_00,hd_keypath);
      KeyOriginInfo::~KeyOriginInfo((KeyOriginInfo *)in_stack_fffffffffffffe38);
      std::_Rb_tree_const_iterator<CExtPubKey>::operator++
                ((_Rb_tree_const_iterator<CExtPubKey> *)in_stack_fffffffffffffe38);
    }
    std::
    _Rb_tree_const_iterator<std::pair<const_KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>_>_>
    ::operator++((_Rb_tree_const_iterator<std::pair<const_KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>_>_>
                  *)in_stack_fffffffffffffe38);
  }
  uVar3 = GetVersion(in_stack_fffffffffffffe50);
  if (uVar3 != 0) {
    in_stack_fffffffffffffe48 = in_RSI;
    CompactSizeWriter::CompactSizeWriter((CompactSizeWriter *)in_stack_fffffffffffffe38,0x6fd75e);
    SerializeToVector<DataStream,CompactSizeWriter>
              ((DataStream *)in_stack_fffffffffffffe50,
               (CompactSizeWriter *)in_stack_fffffffffffffe48);
    std::optional<unsigned_int>::operator*((optional<unsigned_int> *)in_stack_fffffffffffffe38);
    SerializeToVector<DataStream,unsigned_int>
              ((DataStream *)in_RSI,(uint *)in_stack_fffffffffffffe48);
  }
  std::set<PSBTProprietary,_std::less<PSBTProprietary>,_std::allocator<PSBTProprietary>_>::begin
            ((set<PSBTProprietary,_std::less<PSBTProprietary>,_std::allocator<PSBTProprietary>_> *)
             in_stack_fffffffffffffe40);
  std::set<PSBTProprietary,_std::less<PSBTProprietary>,_std::allocator<PSBTProprietary>_>::end
            ((set<PSBTProprietary,_std::less<PSBTProprietary>,_std::allocator<PSBTProprietary>_> *)
             in_stack_fffffffffffffe40);
  while( true ) {
    bVar2 = std::operator==((_Self *)in_stack_fffffffffffffe48,(_Self *)in_stack_fffffffffffffe40);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    std::_Rb_tree_const_iterator<PSBTProprietary>::operator*
              ((_Rb_tree_const_iterator<PSBTProprietary> *)in_stack_fffffffffffffe38);
    DataStream::operator<<
              ((DataStream *)in_stack_fffffffffffffe48,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe40);
    DataStream::operator<<
              ((DataStream *)in_stack_fffffffffffffe48,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe40);
    std::_Rb_tree_const_iterator<PSBTProprietary>::operator++
              ((_Rb_tree_const_iterator<PSBTProprietary> *)in_stack_fffffffffffffe38);
  }
  std::
  map<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::begin((map<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
           *)in_stack_fffffffffffffe40);
  std::
  map<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::end((map<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
         *)in_stack_fffffffffffffe40);
  while( true ) {
    bVar2 = std::operator==((_Self *)in_stack_fffffffffffffe48,(_Self *)in_stack_fffffffffffffe40);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    std::
    _Rb_tree_const_iterator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::operator*((_Rb_tree_const_iterator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 *)in_stack_fffffffffffffe38);
    DataStream::operator<<
              ((DataStream *)in_stack_fffffffffffffe48,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe40);
    DataStream::operator<<
              ((DataStream *)in_stack_fffffffffffffe48,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe40);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::operator++((_Rb_tree_const_iterator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)in_stack_fffffffffffffe38);
  }
  DataStream::operator<<((DataStream *)in_stack_fffffffffffffe48,(uchar *)in_stack_fffffffffffffe40)
  ;
  std::vector<PSBTInput,_std::allocator<PSBTInput>_>::begin
            ((vector<PSBTInput,_std::allocator<PSBTInput>_> *)in_stack_fffffffffffffe40);
  std::vector<PSBTInput,_std::allocator<PSBTInput>_>::end
            ((vector<PSBTInput,_std::allocator<PSBTInput>_> *)in_stack_fffffffffffffe40);
  while( true ) {
    bVar2 = __gnu_cxx::
            operator==<const_PSBTInput_*,_std::vector<PSBTInput,_std::allocator<PSBTInput>_>_>
                      ((__normal_iterator<const_PSBTInput_*,_std::vector<PSBTInput,_std::allocator<PSBTInput>_>_>
                        *)in_stack_fffffffffffffe48,
                       (__normal_iterator<const_PSBTInput_*,_std::vector<PSBTInput,_std::allocator<PSBTInput>_>_>
                        *)in_stack_fffffffffffffe40);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    __gnu_cxx::
    __normal_iterator<const_PSBTInput_*,_std::vector<PSBTInput,_std::allocator<PSBTInput>_>_>::
    operator*((__normal_iterator<const_PSBTInput_*,_std::vector<PSBTInput,_std::allocator<PSBTInput>_>_>
               *)in_stack_fffffffffffffe38);
    DataStream::operator<<((DataStream *)in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
    __gnu_cxx::
    __normal_iterator<const_PSBTInput_*,_std::vector<PSBTInput,_std::allocator<PSBTInput>_>_>::
    operator++((__normal_iterator<const_PSBTInput_*,_std::vector<PSBTInput,_std::allocator<PSBTInput>_>_>
                *)in_stack_fffffffffffffe38);
  }
  std::vector<PSBTOutput,_std::allocator<PSBTOutput>_>::begin
            ((vector<PSBTOutput,_std::allocator<PSBTOutput>_> *)in_stack_fffffffffffffe40);
  std::vector<PSBTOutput,_std::allocator<PSBTOutput>_>::end
            ((vector<PSBTOutput,_std::allocator<PSBTOutput>_> *)in_stack_fffffffffffffe40);
  while( true ) {
    bVar2 = __gnu_cxx::
            operator==<const_PSBTOutput_*,_std::vector<PSBTOutput,_std::allocator<PSBTOutput>_>_>
                      ((__normal_iterator<const_PSBTOutput_*,_std::vector<PSBTOutput,_std::allocator<PSBTOutput>_>_>
                        *)in_stack_fffffffffffffe48,
                       (__normal_iterator<const_PSBTOutput_*,_std::vector<PSBTOutput,_std::allocator<PSBTOutput>_>_>
                        *)in_stack_fffffffffffffe40);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    __gnu_cxx::
    __normal_iterator<const_PSBTOutput_*,_std::vector<PSBTOutput,_std::allocator<PSBTOutput>_>_>::
    operator*((__normal_iterator<const_PSBTOutput_*,_std::vector<PSBTOutput,_std::allocator<PSBTOutput>_>_>
               *)in_stack_fffffffffffffe38);
    DataStream::operator<<
              ((DataStream *)in_stack_fffffffffffffe48,(PSBTOutput *)in_stack_fffffffffffffe40);
    __gnu_cxx::
    __normal_iterator<const_PSBTOutput_*,_std::vector<PSBTOutput,_std::allocator<PSBTOutput>_>_>::
    operator++((__normal_iterator<const_PSBTOutput_*,_std::vector<PSBTOutput,_std::allocator<PSBTOutput>_>_>
                *)in_stack_fffffffffffffe38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

inline void Serialize(Stream& s) const {

        // magic bytes
        s << PSBT_MAGIC_BYTES;

        // unsigned tx flag
        SerializeToVector(s, CompactSizeWriter(PSBT_GLOBAL_UNSIGNED_TX));

        // Write serialized tx to a stream
        SerializeToVector(s, TX_NO_WITNESS(*tx));

        // Write xpubs
        for (const auto& xpub_pair : m_xpubs) {
            for (const auto& xpub : xpub_pair.second) {
                unsigned char ser_xpub[BIP32_EXTKEY_WITH_VERSION_SIZE];
                xpub.EncodeWithVersion(ser_xpub);
                // Note that the serialization swaps the key and value
                // The xpub is the key (for uniqueness) while the path is the value
                SerializeToVector(s, PSBT_GLOBAL_XPUB, ser_xpub);
                SerializeHDKeypath(s, xpub_pair.first);
            }
        }

        // PSBT version
        if (GetVersion() > 0) {
            SerializeToVector(s, CompactSizeWriter(PSBT_GLOBAL_VERSION));
            SerializeToVector(s, *m_version);
        }

        // Write proprietary things
        for (const auto& entry : m_proprietary) {
            s << entry.key;
            s << entry.value;
        }

        // Write the unknown things
        for (auto& entry : unknown) {
            s << entry.first;
            s << entry.second;
        }

        // Separator
        s << PSBT_SEPARATOR;

        // Write inputs
        for (const PSBTInput& input : inputs) {
            s << input;
        }
        // Write outputs
        for (const PSBTOutput& output : outputs) {
            s << output;
        }
    }